

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AllOptions::add<Catch::Options::OutputOptionParser>(AllOptions *this)

{
  OptionParser *p;
  Ptr<Catch::OptionParser> local_18;
  AllOptions *local_10;
  AllOptions *this_local;
  
  local_10 = this;
  p = (OptionParser *)operator_new(0x30);
  Options::OutputOptionParser::OutputOptionParser((OutputOptionParser *)p);
  Ptr<Catch::OptionParser>::Ptr(&local_18,p);
  std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>::
  push_back(&this->m_parsers,&local_18);
  Ptr<Catch::OptionParser>::~Ptr(&local_18);
  return;
}

Assistant:

void add() {
            m_parsers.push_back( new T() );
        }